

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O0

void __thiscall re2::BitState::GrowStack(BitState *this)

{
  Job *__dest;
  Job *__src;
  PODArray<re2::Job> *in_RDI;
  PODArray<re2::Job> tmp;
  int in_stack_ffffffffffffffdc;
  PODArray<re2::Job> *in_stack_ffffffffffffffe0;
  
  PODArray<re2::Job>::size((PODArray<re2::Job> *)0x23215c);
  PODArray<re2::Job>::PODArray(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  __dest = PODArray<re2::Job>::data((PODArray<re2::Job> *)0x232179);
  __src = PODArray<re2::Job>::data((PODArray<re2::Job> *)0x23218e);
  memmove(__dest,__src,
          (long)(int)in_RDI[7].ptr_._M_t.
                     super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>._M_t.
                     super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
                     super__Tuple_impl<1UL,_re2::PODArray<re2::Job>::Deleter>.
                     super__Head_base<1UL,_re2::PODArray<re2::Job>::Deleter,_false> << 4);
  PODArray<re2::Job>::operator=(in_RDI,(PODArray<re2::Job> *)__src);
  PODArray<re2::Job>::~PODArray((PODArray<re2::Job> *)0x2321cc);
  return;
}

Assistant:

void BitState::GrowStack() {
  PODArray<Job> tmp(2*job_.size());
  memmove(tmp.data(), job_.data(), njob_*sizeof job_[0]);
  job_ = std::move(tmp);
}